

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O3

void __thiscall RtApiAlsa::probeDevices(RtApiAlsa *this)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  pointer pcVar2;
  void *pvVar3;
  pointer ppVar4;
  long lVar5;
  pointer __pos;
  undefined1 *puVar6;
  RtApi *pRVar7;
  _Alloc_hider _Var8;
  undefined1 auVar9 [8];
  uint uVar10;
  RtApiAlsa *pRVar11;
  int iVar12;
  bool bVar13;
  int iVar14;
  long lVar15;
  size_t sVar16;
  string *this_00;
  undefined8 uVar17;
  undefined8 uVar18;
  ostream *poVar19;
  char *pcVar20;
  iterator __position;
  iterator __position_00;
  ulong uVar21;
  DeviceInfo *pDVar22;
  pointer ppVar23;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *ppVar24;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *d;
  undefined8 *puVar25;
  long *plVar26;
  char *__s;
  void *__s_00;
  undefined8 uStack_200;
  char local_1f8 [8];
  char name [128];
  string local_170;
  undefined1 local_150 [8];
  string prettyName;
  string defaultDeviceName;
  string id;
  undefined1 local_e8 [8];
  DeviceInfo info;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  deviceID_prettyName;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *__range2;
  snd_ctl_t *handle;
  ostream *poStack_48;
  int device;
  RtApiAlsa *local_40;
  int local_34 [2];
  int card;
  
  __range2 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)0x0;
  uStack_200 = 0x10b3c9;
  local_40 = this;
  lVar15 = snd_ctl_card_info_sizeof();
  lVar15 = -(lVar15 + 0xfU & 0xfffffffffffffff0);
  __s = local_1f8 + lVar15;
  *(undefined8 *)((long)&uStack_200 + lVar15) = 0x10b3df;
  sVar16 = snd_ctl_card_info_sizeof();
  *(undefined8 *)((long)&uStack_200 + lVar15) = 0x10b3ec;
  memset(__s,0,sVar16);
  *(undefined8 *)((long)&uStack_200 + lVar15) = 0x10b3f1;
  lVar15 = snd_pcm_info_sizeof();
  __s_00 = __s + -(lVar15 + 0xfU & 0xfffffffffffffff0);
  *(undefined8 *)((long)__s_00 + -8) = 0x10b407;
  sVar16 = snd_pcm_info_sizeof();
  *(undefined8 *)((long)__s_00 + -8) = 0x10b414;
  memset(__s_00,0,sVar16);
  info.nativeFormats = 0;
  prettyName.field_2._8_8_ = &defaultDeviceName._M_string_length;
  defaultDeviceName._M_dataplus._M_p = (pointer)0x0;
  defaultDeviceName._M_string_length._0_1_ = 0;
  *(undefined8 *)((long)__s_00 + -8) = 0x10b442;
  iVar14 = snd_ctl_open(&__range2,"default",0);
  if (iVar14 == 0) {
    *(undefined8 *)((long)__s_00 + -8) = 0x10b460;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[8],_const_char_(&)[20],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_e8,(char (*) [8])"default",(char (*) [20])"Default ALSA Device");
    *(undefined8 *)((long)__s_00 + -8) = 0x10b470;
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&info.nativeFormats,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_e8);
    uVar17 = info.name.field_2._M_allocated_capacity;
    if ((uint *)info.name.field_2._M_allocated_capacity != &info.outputChannels) {
      *(undefined8 *)((long)__s_00 + -8) = 0x10b485;
      operator_delete((void *)uVar17);
    }
    puVar6 = (undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_);
    if ((string *)puVar6 != &info.name) {
      *(undefined8 *)((long)__s_00 + -8) = 0x10b49a;
      operator_delete(puVar6);
    }
    *(undefined8 *)((long)__s_00 + -8) = 0x10b4ae;
    std::__cxx11::string::_M_assign((string *)(prettyName.field_2._M_local_buf + 8));
    pvVar1 = __range2;
    *(undefined8 *)((long)__s_00 + -8) = 0x10b4b7;
    snd_ctl_close(pvVar1);
    *(undefined8 *)((long)__s_00 + -8) = 0x10b4bc;
    snd_config_update_free_global();
  }
  *(undefined8 *)((long)__s_00 + -8) = 0x10b4ce;
  iVar14 = snd_ctl_open(&__range2,"pulse",0);
  if (iVar14 == 0) {
    *(undefined8 *)((long)__s_00 + -8) = 0x10b4ec;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[6],_const_char_(&)[24],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_e8,(char (*) [6])"pulse",(char (*) [24])"PulseAudio Sound Server");
    *(undefined8 *)((long)__s_00 + -8) = 0x10b4fc;
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&info.nativeFormats,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_e8);
    uVar17 = info.name.field_2._M_allocated_capacity;
    if ((uint *)info.name.field_2._M_allocated_capacity != &info.outputChannels) {
      *(undefined8 *)((long)__s_00 + -8) = 0x10b511;
      operator_delete((void *)uVar17);
    }
    puVar6 = (undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_);
    if ((string *)puVar6 != &info.name) {
      *(undefined8 *)((long)__s_00 + -8) = 0x10b526;
      operator_delete(puVar6);
    }
    pvVar1 = __range2;
    *(undefined8 *)((long)__s_00 + -8) = 0x10b52f;
    snd_ctl_close(pvVar1);
    *(undefined8 *)((long)__s_00 + -8) = 0x10b534;
    snd_config_update_free_global();
  }
  local_34[0] = -1;
  *(undefined8 *)((long)__s_00 + -8) = 0x10b543;
  snd_card_next();
  poStack_48 = (ostream *)&(local_40->super_RtApi).errorStream_;
  this_00 = &(local_40->super_RtApi).errorText_;
  while (pRVar11 = local_40, -1 < local_34[0]) {
    *(undefined8 *)((long)__s_00 + -8) = 0x10b584;
    sprintf(local_1f8,"hw:%d");
    *(undefined8 *)((long)__s_00 + -8) = 0x10b592;
    iVar14 = snd_ctl_open(&__range2,local_1f8,0);
    poVar19 = poStack_48;
    pvVar1 = __range2;
    if (iVar14 < 0) {
      __range2 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  *)0x0;
      *(undefined8 *)((long)__s_00 + -8) = 0x10b8bc;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar19,"RtApiAlsa::probeDevices: control open, card = ",0x2e);
      iVar12 = local_34[0];
      poVar19 = poStack_48;
      *(undefined8 *)((long)__s_00 + -8) = 0x10b8c8;
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar12);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b8df;
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b8e6;
      pcVar20 = (char *)snd_strerror(iVar14);
      if (pcVar20 == (char *)0x0) {
        uVar17 = *(undefined8 *)(*(long *)poVar19 + -0x18);
        *(undefined8 *)((long)__s_00 + -8) = 0x10b9f4;
        std::ios::clear((int)poVar19 + (int)uVar17);
      }
      else {
        *(undefined8 *)((long)__s_00 + -8) = 0x10b8fa;
        sVar16 = strlen(pcVar20);
        *(undefined8 *)((long)__s_00 + -8) = 0x10b908;
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,pcVar20,sVar16);
      }
      *(undefined8 *)((long)__s_00 + -8) = 0x10ba08;
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,".",1);
      *(undefined8 *)((long)__s_00 + -8) = 0x10ba1b;
      std::__cxx11::stringbuf::str();
    }
    else {
      *(undefined8 *)((long)__s_00 + -8) = 0x10b5a8;
      iVar14 = snd_ctl_card_info(pvVar1,__s);
      poVar19 = poStack_48;
      if (iVar14 < 0) {
        *(undefined8 *)((long)__s_00 + -8) = 0x10b922;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19,"RtApiAlsa::probeDevices: control info, card = ",0x2e);
        iVar12 = local_34[0];
        poVar19 = poStack_48;
        *(undefined8 *)((long)__s_00 + -8) = 0x10b92e;
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar12);
        *(undefined8 *)((long)__s_00 + -8) = 0x10b945;
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
        *(undefined8 *)((long)__s_00 + -8) = 0x10b94c;
        pcVar20 = (char *)snd_strerror(iVar14);
        if (pcVar20 == (char *)0x0) {
          uVar17 = *(undefined8 *)(*(long *)poVar19 + -0x18);
          *(undefined8 *)((long)__s_00 + -8) = 0x10ba3b;
          std::ios::clear((int)poVar19 + (int)uVar17);
        }
        else {
          *(undefined8 *)((long)__s_00 + -8) = 0x10b960;
          sVar16 = strlen(pcVar20);
          *(undefined8 *)((long)__s_00 + -8) = 0x10b96e;
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,pcVar20,sVar16);
        }
        *(undefined8 *)((long)__s_00 + -8) = 0x10ba4f;
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,".",1);
        *(undefined8 *)((long)__s_00 + -8) = 0x10ba62;
        std::__cxx11::stringbuf::str();
      }
      else {
        handle._4_4_ = 0xffffffff;
LAB_0010b5b9:
        pvVar1 = __range2;
        *(undefined8 *)((long)__s_00 + -8) = 0x10b5c6;
        iVar14 = snd_ctl_pcm_next_device(pvVar1,(long)&handle + 4);
        poVar19 = poStack_48;
        if (-1 < iVar14) {
          if (-1 < (int)handle._4_4_) {
            *(undefined8 *)((long)__s_00 + -8) = 0x10b5e3;
            snd_pcm_info_set_device(__s_00);
            *(undefined8 *)((long)__s_00 + -8) = 0x10b5ed;
            snd_pcm_info_set_subdevice(__s_00,0);
            *(undefined8 *)((long)__s_00 + -8) = 0x10b5f7;
            snd_pcm_info_set_stream(__s_00,0);
            pvVar1 = __range2;
            *(undefined8 *)((long)__s_00 + -8) = 0x10b603;
            iVar14 = snd_ctl_pcm_info(pvVar1,__s_00);
            if (iVar14 < 0) goto LAB_0010b779;
            goto LAB_0010b60b;
          }
          goto LAB_0010bad8;
        }
        *(undefined8 *)((long)__s_00 + -8) = 0x10b988;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19,"RtApiAlsa::probeDevices: control next device, card = ",0x35);
        iVar12 = local_34[0];
        poVar19 = poStack_48;
        *(undefined8 *)((long)__s_00 + -8) = 0x10b994;
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar12);
        *(undefined8 *)((long)__s_00 + -8) = 0x10b9ab;
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
        *(undefined8 *)((long)__s_00 + -8) = 0x10b9b2;
        pcVar20 = (char *)snd_strerror(iVar14);
        if (pcVar20 == (char *)0x0) {
          uVar17 = *(undefined8 *)(*(long *)poVar19 + -0x18);
          *(undefined8 *)((long)__s_00 + -8) = 0x10ba7f;
          std::ios::clear((int)poVar19 + (int)uVar17);
        }
        else {
          *(undefined8 *)((long)__s_00 + -8) = 0x10b9c6;
          sVar16 = strlen(pcVar20);
          *(undefined8 *)((long)__s_00 + -8) = 0x10b9d4;
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,pcVar20,sVar16);
        }
        *(undefined8 *)((long)__s_00 + -8) = 0x10ba93;
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,".",1);
        *(undefined8 *)((long)__s_00 + -8) = 0x10baa6;
        std::__cxx11::stringbuf::str();
      }
    }
    *(undefined8 *)((long)__s_00 + -8) = 0x10bab2;
    std::__cxx11::string::operator=((string *)this_00,(string *)local_e8);
    puVar6 = (undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_);
    if ((string *)puVar6 != &info.name) {
      *(undefined8 *)((long)__s_00 + -8) = 0x10baca;
      operator_delete(puVar6);
    }
    pRVar11 = local_40;
    *(undefined8 *)((long)__s_00 + -8) = 0x10bad8;
    RtApi::error(&pRVar11->super_RtApi,RTAUDIO_WARNING);
LAB_0010bad8:
    if (__range2 !=
        (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)0x0) {
      *(undefined8 *)((long)__s_00 + -8) = 0x10bae6;
      snd_ctl_close();
      *(undefined8 *)((long)__s_00 + -8) = 0x10baeb;
      snd_config_update_free_global();
    }
    *(undefined8 *)((long)__s_00 + -8) = 0x10baf4;
    snd_card_next(local_34);
  }
  poStack_48 = (ostream *)0x0;
  if (info.nativeFormats == 0) {
    pRVar7 = &local_40->super_RtApi;
    __pos = (local_40->super_RtApi).deviceList_.
            super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
    *(undefined8 *)((long)__s_00 + -8) = 0x10be46;
    std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::_M_erase_at_end
              (&pRVar7->deviceList_,__pos);
    *(undefined8 *)((long)__s_00 + -8) = 0x10be55;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::clear(&pRVar11->deviceIdPairs_);
  }
  else {
    pvVar1 = &local_40->deviceIdPairs_;
    __position._M_current =
         (local_40->deviceIdPairs_).
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ppVar24 = (local_40->deviceIdPairs_).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current != ppVar24) {
      do {
        if (info.nativeFormats != 0) {
          sVar16 = ((__position._M_current)->first)._M_string_length;
          puVar25 = (undefined8 *)info.nativeFormats;
          do {
            if (puVar25[1] == sVar16) {
              if (sVar16 != 0) {
                pcVar2 = ((__position._M_current)->first)._M_dataplus._M_p;
                pvVar3 = (void *)*puVar25;
                *(undefined8 *)((long)__s_00 + -8) = 0x10bb5c;
                iVar14 = bcmp(pvVar3,pcVar2,sVar16);
                if (iVar14 != 0) goto LAB_0010bb60;
              }
              __position._M_current = __position._M_current + 1;
              goto LAB_0010bb89;
            }
LAB_0010bb60:
            puVar25 = puVar25 + 8;
          } while (puVar25 != (undefined8 *)0x0);
        }
        *(undefined8 *)((long)__s_00 + -8) = 0x10bb75;
        __position = std::
                     vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ::_M_erase(pvVar1,__position);
        ppVar24 = (local_40->deviceIdPairs_).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
LAB_0010bb89:
      } while (__position._M_current != ppVar24);
    }
    poStack_48 = (ostream *)0x0;
    if (info.nativeFormats != 0) {
      pRVar7 = &local_40->super_RtApi;
      ppVar24 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                 *)((long)&defaultDeviceName.field_2 + 8);
      plVar26 = (long *)info.nativeFormats;
      do {
        ppVar23 = (local_40->deviceIdPairs_).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar4 = (local_40->deviceIdPairs_).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (ppVar23 != ppVar4) {
          sVar16 = plVar26[1];
          do {
            if (sVar16 == (ppVar23->first)._M_string_length) {
              if (sVar16 == 0) goto LAB_0010bdaa;
              pcVar2 = (ppVar23->first)._M_dataplus._M_p;
              pvVar3 = (void *)*plVar26;
              *(undefined8 *)((long)__s_00 + -8) = 0x10bbfa;
              iVar14 = bcmp(pvVar3,pcVar2,sVar16);
              if (iVar14 == 0) goto LAB_0010bdaa;
            }
            ppVar23 = ppVar23 + 1;
          } while (ppVar23 != ppVar4);
        }
        local_e8._0_4_ = 0;
        info._0_8_ = &info.name._M_string_length;
        info.name._M_dataplus._M_p = (pointer)0x0;
        info.name._M_string_length._0_1_ = 0;
        info.outputChannels = 0;
        info.inputChannels._0_1_ = 0;
        info.inputChannels._1_1_ = 0;
        info.name.field_2._8_4_ = 0;
        info.name.field_2._12_2_ = 0;
        info.name.field_2._14_2_ = 0;
        info.currentSampleRate = 0;
        info.preferredSampleRate = 0;
        info.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        info.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        info.duplexChannels = 0;
        info.isDefaultOutput = false;
        info.isDefaultInput = false;
        info._54_2_ = 0;
        info.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        *(undefined8 *)((long)__s_00 + -8) = 0x10bc5d;
        std::__cxx11::string::_M_assign((string *)&info);
        lVar15 = *plVar26;
        lVar5 = plVar26[1];
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        *(undefined8 *)((long)__s_00 + -8) = 0x10bc85;
        std::__cxx11::string::_M_construct<char*>((string *)&local_170,lVar15,lVar5 + lVar15);
        pRVar11 = local_40;
        *(undefined8 *)((long)__s_00 + -8) = 0x10bc98;
        bVar13 = probeDeviceInfo(pRVar11,(DeviceInfo *)local_e8,&local_170);
        _Var8._M_p = local_170._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          *(undefined8 *)((long)__s_00 + -8) = 0x10bcac;
          operator_delete(_Var8._M_p);
        }
        _Var8._M_p = info.name._M_dataplus._M_p;
        uVar18 = info._0_8_;
        uVar17 = prettyName.field_2._8_8_;
        if (bVar13) {
          local_e8._0_4_ = (local_40->super_RtApi).currentDeviceId_;
          (local_40->super_RtApi).currentDeviceId_ = local_e8._0_4_ + 1;
          if (info.name._M_dataplus._M_p == defaultDeviceName._M_dataplus._M_p) {
            if (info.name._M_dataplus._M_p != (pointer)0x0) {
              *(undefined8 *)((long)__s_00 + -8) = 0x10bcf6;
              iVar14 = bcmp((void *)uVar18,(void *)uVar17,(size_t)_Var8._M_p);
              if (iVar14 != 0) goto LAB_0010bd1a;
            }
            if (info.name.field_2._8_4_ != 0) {
              info.inputChannels._0_1_ = 1;
            }
            if (CONCAT22(info.name.field_2._14_2_,info.name.field_2._12_2_) != 0) {
              info.inputChannels._1_1_ = 1;
            }
          }
LAB_0010bd1a:
          *(undefined8 *)((long)__s_00 + -8) = 0x10bd2a;
          std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::push_back
                    (&pRVar7->deviceList_,(value_type *)local_e8);
          defaultDeviceName.field_2._8_8_ = &id._M_string_length;
          lVar15 = *plVar26;
          lVar5 = plVar26[1];
          *(undefined8 *)((long)__s_00 + -8) = 0x10bd4e;
          std::__cxx11::string::_M_construct<char*>((string *)ppVar24,lVar15,lVar5 + lVar15);
          id.field_2._8_4_ = local_e8._0_4_;
          *(undefined8 *)((long)__s_00 + -8) = 0x10bd66;
          std::
          vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
          ::emplace_back<std::pair<std::__cxx11::string,unsigned_int>>
                    ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                      *)pvVar1,ppVar24);
          uVar17 = defaultDeviceName.field_2._8_8_;
          if ((size_type *)defaultDeviceName.field_2._8_8_ != &id._M_string_length) {
            *(undefined8 *)((long)__s_00 + -8) = 0x10bd7e;
            operator_delete((void *)uVar17);
          }
        }
        uVar17 = info._48_8_;
        if (info._48_8_ != 0) {
          *(undefined8 *)((long)__s_00 + -8) = 0x10bd8f;
          operator_delete((void *)uVar17);
        }
        uVar17 = info._0_8_;
        if ((size_type *)info._0_8_ != &info.name._M_string_length) {
          *(undefined8 *)((long)__s_00 + -8) = 0x10bda7;
          operator_delete((void *)uVar17);
        }
LAB_0010bdaa:
        plVar26 = plVar26 + 8;
      } while ((ostream *)plVar26 != poStack_48);
    }
    __position_00._M_current =
         (local_40->super_RtApi).deviceList_.
         super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
         super__Vector_impl_data._M_start;
    pDVar22 = (local_40->super_RtApi).deviceList_.
              super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (__position_00._M_current != pDVar22) {
      pRVar7 = &local_40->super_RtApi;
      do {
        ppVar23 = (local_40->deviceIdPairs_).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar4 = (local_40->deviceIdPairs_).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (ppVar23 == ppVar4) {
LAB_0010be07:
          if (ppVar23 == ppVar4) goto LAB_0010be12;
          __position_00._M_current = __position_00._M_current + 1;
        }
        else {
          do {
            if ((__position_00._M_current)->ID == ppVar23->second) goto LAB_0010be07;
            ppVar23 = ppVar23 + 1;
          } while (ppVar23 != ppVar4);
LAB_0010be12:
          *(undefined8 *)((long)__s_00 + -8) = 0x10be1d;
          __position_00 =
               std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::_M_erase
                         (&pRVar7->deviceList_,__position_00);
          pDVar22 = (local_40->super_RtApi).deviceList_.
                    super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
      } while (__position_00._M_current != pDVar22);
    }
  }
  uVar17 = prettyName.field_2._8_8_;
  if ((size_type *)prettyName.field_2._8_8_ != &defaultDeviceName._M_string_length) {
    *(undefined8 *)((long)__s_00 + -8) = 0x10be6d;
    operator_delete((void *)uVar17);
  }
  *(undefined8 *)((long)__s_00 + -8) = 0x10be76;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&info.nativeFormats);
  return;
LAB_0010b779:
  if (iVar14 == -2) {
    *(undefined8 *)((long)__s_00 + -8) = 0x10b78f;
    snd_pcm_info_set_stream(__s_00,1);
    pvVar1 = __range2;
    *(undefined8 *)((long)__s_00 + -8) = 0x10b79b;
    iVar14 = snd_ctl_pcm_info(pvVar1,__s_00);
    poVar19 = poStack_48;
    if (iVar14 < 0) {
      *(undefined8 *)((long)__s_00 + -8) = 0x10b7bb;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar19,"RtApiAlsa::probeDevices: control pcm info, card = ",0x32);
      iVar12 = local_34[0];
      poVar19 = poStack_48;
      *(undefined8 *)((long)__s_00 + -8) = 0x10b7c7;
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar12);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b7de;
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,", device = ",0xb);
      uVar10 = handle._4_4_;
      *(undefined8 *)((long)__s_00 + -8) = 0x10b7e9;
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar10);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b800;
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b808;
      pcVar20 = (char *)snd_strerror(iVar14);
      if (pcVar20 == (char *)0x0) {
        uVar17 = *(undefined8 *)(*(long *)poVar19 + -0x18);
        *(undefined8 *)((long)__s_00 + -8) = 0x10b841;
        std::ios::clear((int)poVar19 + (int)uVar17);
      }
      else {
        *(undefined8 *)((long)__s_00 + -8) = 0x10b818;
        sVar16 = strlen(pcVar20);
        *(undefined8 *)((long)__s_00 + -8) = 0x10b826;
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,pcVar20,sVar16);
      }
      *(undefined8 *)((long)__s_00 + -8) = 0x10b855;
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,".",1);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b868;
      std::__cxx11::stringbuf::str();
      *(undefined8 *)((long)__s_00 + -8) = 0x10b874;
      std::__cxx11::string::operator=((string *)this_00,(string *)local_e8);
      puVar6 = (undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_);
      if ((string *)puVar6 != &info.name) {
        *(undefined8 *)((long)__s_00 + -8) = 0x10b88c;
        operator_delete(puVar6);
      }
      pRVar11 = local_40;
      *(undefined8 *)((long)__s_00 + -8) = 0x10b89a;
      RtApi::error(&pRVar11->super_RtApi,RTAUDIO_WARNING);
    }
    else {
LAB_0010b60b:
      *(undefined8 *)((long)__s_00 + -8) = 0x10b613;
      uVar17 = snd_ctl_card_info_get_id(__s);
      uVar21 = (ulong)handle._4_4_;
      *(undefined8 *)((long)__s_00 + -8) = 0x10b62a;
      sprintf(local_1f8,"hw:%s,%d",uVar17,uVar21);
      defaultDeviceName.field_2._8_8_ = &id._M_string_length;
      *(undefined8 *)((long)__s_00 + -8) = 0x10b640;
      sVar16 = strlen(local_1f8);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b65a;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&defaultDeviceName.field_2 + 8),local_1f8,local_1f8 + sVar16);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b662;
      uVar17 = snd_ctl_card_info_get_name(__s);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b66d;
      uVar18 = snd_pcm_info_get_id(__s_00);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b684;
      sprintf(local_1f8,"%s (%s)",uVar17,uVar18);
      local_150 = (undefined1  [8])&prettyName._M_string_length;
      *(undefined8 *)((long)__s_00 + -8) = 0x10b69a;
      sVar16 = strlen(local_1f8);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b6b7;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_150,local_1f8,local_1f8 + sVar16);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b6d0;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&defaultDeviceName.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b6dc;
      std::
      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)&info.nativeFormats,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_e8);
      uVar17 = info.name.field_2._M_allocated_capacity;
      if ((uint *)info.name.field_2._M_allocated_capacity != &info.outputChannels) {
        *(undefined8 *)((long)__s_00 + -8) = 0x10b6f4;
        operator_delete((void *)uVar17);
      }
      puVar6 = (undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_);
      if ((string *)puVar6 != &info.name) {
        *(undefined8 *)((long)__s_00 + -8) = 0x10b70c;
        operator_delete(puVar6);
      }
      if (((local_34[0] == 0) && (handle._4_4_ == 0)) &&
         (defaultDeviceName._M_dataplus._M_p == (pointer)0x0)) {
        *(undefined8 *)((long)__s_00 + -8) = 0x10b72a;
        strlen(local_1f8);
        *(undefined8 *)((long)__s_00 + -8) = 0x10b740;
        std::__cxx11::string::_M_replace
                  ((ulong)((long)&prettyName.field_2 + 8),0,(char *)0x0,(ulong)local_1f8);
      }
      auVar9 = local_150;
      if (local_150 != (undefined1  [8])&prettyName._M_string_length) {
        *(undefined8 *)((long)__s_00 + -8) = 0x10b758;
        operator_delete((void *)auVar9);
      }
      uVar17 = defaultDeviceName.field_2._8_8_;
      if ((size_type *)defaultDeviceName.field_2._8_8_ != &id._M_string_length) {
        *(undefined8 *)((long)__s_00 + -8) = 0x10b774;
        operator_delete((void *)uVar17);
      }
    }
  }
  goto LAB_0010b5b9;
}

Assistant:

void RtApiAlsa :: probeDevices( void )
{
  // See list of required functionality in RtApi::probeDevices().
  
  int result, device, card;
  char name[128];
  snd_ctl_t *handle = 0;
  snd_ctl_card_info_t *ctlinfo;
  snd_pcm_info_t *pcminfo;
  snd_ctl_card_info_alloca(&ctlinfo);
  snd_pcm_info_alloca(&pcminfo);
  // First element isthe device hw ID, second is the device "pretty name"
  std::vector<std::pair<std::string, std::string>> deviceID_prettyName;
  snd_pcm_stream_t stream;
  std::string defaultDeviceName;

  // Add the default interface if available.
  result = snd_ctl_open( &handle, "default", 0 );
  if (result == 0) {
    deviceID_prettyName.push_back({"default", "Default ALSA Device"});
    defaultDeviceName = deviceID_prettyName[0].second;
    snd_ctl_close( handle );
    snd_config_update_free_global();
  }

  // Add the Pulse interface if available.
  result = snd_ctl_open( &handle, "pulse", 0 );
  if (result == 0) {
    deviceID_prettyName.push_back({"pulse",  "PulseAudio Sound Server"});
    snd_ctl_close( handle );
    snd_config_update_free_global();
  }
  
  // Count cards and devices and get ascii identifiers.
  card = -1;
  snd_card_next( &card );
  while ( card >= 0 ) {
    sprintf( name, "hw:%d", card );
    result = snd_ctl_open( &handle, name, 0 );
    if ( result < 0 ) {
      handle = 0;
      errorStream_ << "RtApiAlsa::probeDevices: control open, card = " << card << ", " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      error( RTAUDIO_WARNING );
      goto nextcard;
    }
    result = snd_ctl_card_info( handle, ctlinfo );
    if ( result < 0 ) {
      errorStream_ << "RtApiAlsa::probeDevices: control info, card = " << card << ", " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      error( RTAUDIO_WARNING );
      goto nextcard;
    }
    device = -1;
    while( 1 ) {
      result = snd_ctl_pcm_next_device( handle, &device );
      if ( result < 0 ) {
        errorStream_ << "RtApiAlsa::probeDevices: control next device, card = " << card << ", " << snd_strerror( result ) << ".";
        errorText_ = errorStream_.str();
        error( RTAUDIO_WARNING );
        break;
      }
      if ( device < 0 )
        break;

      snd_pcm_info_set_device( pcminfo, device );
      snd_pcm_info_set_subdevice( pcminfo, 0 );
      stream = SND_PCM_STREAM_PLAYBACK;
      snd_pcm_info_set_stream( pcminfo, stream );
      result = snd_ctl_pcm_info( handle, pcminfo );
      if ( result < 0 ) {
        if ( result == -ENOENT ) { // try as input stream
          stream = SND_PCM_STREAM_CAPTURE;
          snd_pcm_info_set_stream( pcminfo, stream );
          result = snd_ctl_pcm_info( handle, pcminfo );
          if ( result < 0 ) {
            errorStream_ << "RtApiAlsa::probeDevices: control pcm info, card = " << card << ", device = " << device << ", " << snd_strerror( result ) << ".";
            errorText_ = errorStream_.str();
            error( RTAUDIO_WARNING );
            continue;
          }
        }
        else continue;
      }
      sprintf( name, "hw:%s,%d", snd_ctl_card_info_get_id(ctlinfo), device );
      std::string id(name);
      sprintf( name, "%s (%s)", snd_ctl_card_info_get_name(ctlinfo), snd_pcm_info_get_id(pcminfo) );
      std::string prettyName(name);
      deviceID_prettyName.push_back( {id, prettyName} );
      if ( card == 0 && device == 0 && defaultDeviceName.empty() )
        defaultDeviceName = name;
    }
  nextcard:
    if ( handle ) {
      snd_ctl_close( handle );
      snd_config_update_free_global();
    }
    snd_card_next( &card );
  }

  if ( deviceID_prettyName.size() == 0 ) {
    deviceList_.clear();
    deviceIdPairs_.clear();
    return;
  }

  // Clean removed devices
  for ( auto it = deviceIdPairs_.begin(); it != deviceIdPairs_.end(); ) {
    bool found = false;
    for ( auto& d: deviceID_prettyName ) {
      if ( d.first == (*it).first ) {
        found = true;
        break;
      }
    }

    if ( found )
      ++it;
    else
      it = deviceIdPairs_.erase(it);
  }

  // Fill or update the deviceList_ and also save a corresponding list of Ids.
  for ( auto& d : deviceID_prettyName ) {
    bool found = false;
    for ( auto& dID : deviceIdPairs_ ) {
      if ( d.first == dID.first ) {
        found = true;
        break; // We already have this device.
      }
    }

    if ( found )
      continue;

    // new device
    RtAudio::DeviceInfo info;
    info.name = d.second;
    if ( probeDeviceInfo( info, d.first ) == false ) continue; // ignore if probe fails
    info.ID = currentDeviceId_++;  // arbitrary internal device ID
    if ( info.name == defaultDeviceName ) {
      if ( info.outputChannels > 0 ) info.isDefaultOutput = true;
      if ( info.inputChannels > 0 ) info.isDefaultInput = true;
    }
    deviceList_.push_back( info );
    deviceIdPairs_.push_back({d.first, info.ID});
    // I don't see that ALSA provides property listeners to know if
    // devices are removed or added.
  }

  // Remove any devices left in the list that are no longer available.
  for ( std::vector<RtAudio::DeviceInfo>::iterator it=deviceList_.begin(); it!=deviceList_.end(); )
  {
    auto itID = deviceIdPairs_.begin();
    while ( itID != deviceIdPairs_.end() ) {
      if ( (*it).ID == (*itID).second ) {
        break;
      }
      ++itID;
    }

    if ( itID == deviceIdPairs_.end() ) {
      // not found so remove it from our list
      it = deviceList_.erase( it );
    }
    else
      ++it;
  }
}